

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeMapRef.h
# Opt level: O1

CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> * __thiscall
GenApi_3_4::CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>::_GetDeviceName
          (CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams> *this)

{
  ExceptionReporter<GenICam_3_4::AccessException> *this_00;
  long in_RSI;
  ExceptionReporter<GenICam_3_4::AccessException> local_c0;
  
  if (*(long **)(in_RSI + 8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RSI + 8) + 0x38))();
    return this;
  }
  this_00 = (ExceptionReporter<GenICam_3_4::AccessException> *)__cxa_allocate_exception(0x1f0);
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::ExceptionReporter
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/NodeMapRef.h"
             ,0x1a7,"AccessException");
  GenICam_3_4::ExceptionReporter<GenICam_3_4::AccessException>::Report
            (this_00,(char *)&local_c0,"Feature not present (reference not valid)");
  __cxa_throw(this_00,&GenICam_3_4::AccessException::typeinfo,
              GenICam_3_4::GenericException::~GenericException);
}

Assistant:

inline GENICAM_NAMESPACE::gcstring CNodeMapRefT<TCameraParams>::_GetDeviceName() const
    {
        if(_Ptr)
            return _Ptr->GetDeviceName();
        throw ACCESS_EXCEPTION("Feature not present (reference not valid)");
    }